

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O2

void __thiscall HEkk::debugInitialise(HEkk *this)

{
  int iVar1;
  HighsOptions *pHVar2;
  byte bVar3;
  
  iVar1 = this->debug_solve_call_num_;
  this->debug_solve_call_num_ = iVar1 + 1;
  this->debug_initial_build_synthetic_tick_ = (int)this->build_synthetic_tick_;
  if (iVar1 < -0xd) {
LAB_00333682:
    this->debug_solve_report_ = false;
    bVar3 = 0;
  }
  else if (iVar1 + 1 == -0xc) {
    bVar3 = this->build_synthetic_tick_ == 445560.0;
    this->debug_solve_report_ = (bool)bVar3;
  }
  else {
    if (-0xb < iVar1) goto LAB_00333682;
    bVar3 = this->debug_solve_report_;
  }
  this->time_report_ = iVar1 == -2;
  this->debug_basis_report_ = (this->basis_).debug_id == -999;
  if ((bVar3 & 1) == 0) {
    if (iVar1 != -2) goto LAB_00333747;
  }
  else {
    printf("HEkk::solve call %d\n");
    debugReporting(this,-1,2);
    pHVar2 = this->options_;
    (pHVar2->super_HighsOptionsStruct).output_flag = true;
    (pHVar2->super_HighsOptionsStruct).log_dev_level = 3;
    (pHVar2->super_HighsOptionsStruct).highs_debug_level = 2;
    (pHVar2->super_HighsOptionsStruct).highs_analysis_level = 4;
    (this->analysis_).analyse_simplex_runtime_data = true;
    if ((this->time_report_ & 1U) == 0) goto LAB_00333747;
  }
  timeReporting::highs_analysis_level =
       (this->options_->super_HighsOptionsStruct).highs_analysis_level;
  timeReporting(this,0);
LAB_00333747:
  if (this->debug_basis_report_ != true) {
    return;
  }
  printf("HEkk::solve basis %d\n",0xfffffc19);
  return;
}

Assistant:

void HEkk::debugInitialise() {
  debug_solve_call_num_++;
  debug_initial_build_synthetic_tick_ = build_synthetic_tick_;
  const HighsInt debug_from_solve_call_num = -12;
  const HighsInt debug_num_solve = 3;
  const HighsInt debug_to_solve_call_num =
      debug_from_solve_call_num + debug_num_solve - 1;
  const HighsInt debug_build_synthetic_tick = 445560;
  if (debug_solve_call_num_ < debug_from_solve_call_num) {
    debug_solve_report_ = false;
  } else if (debug_solve_call_num_ == debug_from_solve_call_num) {
    debug_solve_report_ = build_synthetic_tick_ == debug_build_synthetic_tick;
  } else if (debug_solve_call_num_ > debug_to_solve_call_num) {
    debug_solve_report_ = false;
  }
  const HighsInt time_from_solve_call_num = -1;
  const HighsInt time_to_solve_call_num = time_from_solve_call_num;
  time_report_ = debug_solve_call_num_ >= time_from_solve_call_num &&
                 debug_solve_call_num_ <= time_to_solve_call_num;
  const HighsInt debug_basis_id = -999;
  debug_basis_report_ = basis_.debug_id == debug_basis_id;
  if (debug_solve_report_) {
    printf("HEkk::solve call %d\n", (int)debug_solve_call_num_);
    debugReporting(-1);
    debugReporting(0, kHighsLogDevLevelVerbose);  // Detailed); //
  }
  if (time_report_) {
    timeReporting(-1);
    timeReporting(0);
  }
  if (debug_basis_report_) {
    printf("HEkk::solve basis %d\n", (int)debug_basis_id);
  }
}